

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

char * __thiscall
testing::internal::UntypedFunctionMockerBase::Name(UntypedFunctionMockerBase *this)

{
  char *pcVar1;
  allocator local_39;
  string local_38;
  
  pcVar1 = this->name_;
  std::__cxx11::string::string
            ((string *)&local_38,
             "Name() must not be called before SetOwnerAndName() has been called.",&local_39);
  Assert(pcVar1 != (char *)0x0,
         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googlemock/src/gmock-spec-builders.cc"
         ,0x169,&local_38);
  std::__cxx11::string::_M_dispose();
  return this->name_;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  const char* name;
  {
    // We protect name_ under g_gmock_mutex in case this mock
    // function is called from two threads concurrently.
    MutexLock l(&g_gmock_mutex);
    Assert(name_ != nullptr, __FILE__, __LINE__,
           "Name() must not be called before SetOwnerAndName() has "
           "been called.");
    name = name_;
  }
  return name;
}